

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_4_suite::test_ctor(void)

{
  undefined8 local_88;
  value_type local_80;
  undefined4 local_74;
  size_type local_70;
  undefined1 local_62;
  undefined1 local_61 [2];
  undefined1 local_5f;
  undefined1 local_5e [2];
  undefined4 local_5c;
  size_type local_58 [2];
  undefined1 local_48 [8];
  moment<double,_4> filter;
  
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_58[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::capacity
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_5c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xd5,"void mean_double_4_suite::test_ctor()",local_58,&local_5c);
  local_5e[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::empty
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_5f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xd6,"void mean_double_4_suite::test_ctor()",local_5e,&local_5f);
  local_61[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::full
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_62 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xd7,"void mean_double_4_suite::test_ctor()",local_61,&local_62);
  local_70 = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_74 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xd8,"void mean_double_4_suite::test_ctor()",&local_70,&local_74);
  local_80 = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_88 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xd9,"void mean_double_4_suite::test_ctor()",&local_80,&local_88);
  return;
}

Assistant:

void test_ctor()
{
    window::moment<double, 4> filter;
    TRIAL_TEST_EQ(filter.capacity(), 4);
    TRIAL_TEST_EQ(filter.empty(), true);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 0);
    TRIAL_TEST_EQ(filter.mean(), 0.0);
}